

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_stage7_ssse3(__m128i *x)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  
  alVar1 = *x;
  alVar2 = x[1];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[2]);
  *x = alVar3;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[2]);
  x[2] = alVar1;
  alVar1 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])x[3]);
  x[1] = alVar1;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])x[3]);
  x[3] = alVar1;
  alVar1 = x[4];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[6]);
  x[4] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[6]);
  x[6] = alVar1;
  alVar1 = x[5];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[7]);
  x[5] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[7]);
  x[7] = alVar1;
  alVar1 = x[8];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[8] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[10] = alVar1;
  alVar1 = x[9];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0xb]);
  x[9] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0xb]);
  x[0xb] = alVar1;
  alVar1 = x[0xc];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0xe]);
  x[0xc] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0xe]);
  x[0xe] = alVar1;
  alVar1 = x[0xd];
  alVar2 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0xf]);
  x[0xd] = alVar2;
  alVar1 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0xf]);
  x[0xf] = alVar1;
  return;
}

Assistant:

static inline void iadst16_stage7_ssse3(__m128i *x) {
  btf_16_adds_subs_sse2(x[0], x[2]);
  btf_16_adds_subs_sse2(x[1], x[3]);
  btf_16_adds_subs_sse2(x[4], x[6]);
  btf_16_adds_subs_sse2(x[5], x[7]);
  btf_16_adds_subs_sse2(x[8], x[10]);
  btf_16_adds_subs_sse2(x[9], x[11]);
  btf_16_adds_subs_sse2(x[12], x[14]);
  btf_16_adds_subs_sse2(x[13], x[15]);
}